

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O1

string * __thiscall
gl4cts::ShaderSubroutine::NegativeTest6::getFragmentShaderBody_abi_cxx11_
          (string *__return_storage_ptr__,NegativeTest6 *this,bool include_invalid_declaration)

{
  char *pcVar1;
  stringstream result_sstream;
  stringstream local_1a0 [16];
  undefined1 local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,
             "#version 400\n\n#extension GL_ARB_shader_subroutine : require\n\n",0x3d);
  if (include_invalid_declaration) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,
               "subroutine void subroutineTestTypeFS(out vec4 test);\n\nsubroutine(subroutineTestTypeFS) void test_impl1(out vec4 test)\n{\n    test = vec4(1, 2, 3, 4);\n}\n\nvoid test_impl1(out vec4 test)\n{\n    test = vec4(2, 3, 4, 5);\n}\n\nsubroutine uniform subroutineTestTypeFS test_subroutineFS;\n"
               ,0x114);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"\nout vec4 result;\n\nvoid main()\n{\n",0x21);
  pcVar1 = "    result = vec4(0, 1, 2, 3);\n";
  if (include_invalid_declaration) {
    pcVar1 = "    test_subroutineFS(result);\n";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,pcVar1,0x1f);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"}\n",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

std::string NegativeTest6::getFragmentShaderBody(bool include_invalid_declaration) const
{
	std::stringstream result_sstream;

	result_sstream << "#version 400\n"
					  "\n"
					  "#extension GL_ARB_shader_subroutine : require\n"
					  "\n";

	if (include_invalid_declaration)
	{
		result_sstream << "subroutine void subroutineTestTypeFS(out vec4 test);\n"
						  "\n"
						  "subroutine(subroutineTestTypeFS) void test_impl1(out vec4 test)\n"
						  "{\n"
						  "    test = vec4(1, 2, 3, 4);\n"
						  "}\n"
						  "\n"
						  "void test_impl1(out vec4 test)\n"
						  "{\n"
						  "    test = vec4(2, 3, 4, 5);\n"
						  "}\n"
						  "\n"
						  "subroutine uniform subroutineTestTypeFS test_subroutineFS;\n";
	};

	result_sstream << "\n"
					  "out vec4 result;\n"
					  "\n"
					  "void main()\n"
					  "{\n";

	if (include_invalid_declaration)
	{
		result_sstream << "    test_subroutineFS(result);\n";
	}
	else
	{
		result_sstream << "    result = vec4(0, 1, 2, 3);\n";
	}

	result_sstream << "}\n";

	return result_sstream.str();
}